

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_loader.cpp
# Opt level: O2

void embree::fix_bspline_end_points
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *indices,
               avector<Vec3ff> *positions)

{
  Vec3fx *pVVar1;
  Vec3fx *pVVar2;
  pointer puVar3;
  Vec3fx *pVVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  size_t i;
  ulong uVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  uint uVar26;
  uint uVar27;
  uint uVar28;
  
  for (i = 0; puVar3 = (indices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                       _M_impl.super__Vector_impl_data._M_start,
      i < (ulong)((long)(indices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                        _M_impl.super__Vector_impl_data._M_finish - (long)puVar3 >> 2); i = i + 1) {
    uVar20 = (ulong)puVar3[i];
    pVVar4 = positions->items;
    pVVar1 = pVVar4 + uVar20;
    uVar17 = *(uint *)((long)&pVVar1->field_0 + 4);
    uVar18 = *(uint *)((long)&pVVar1->field_0 + 8);
    uVar19 = *(uint *)((long)&pVVar1->field_0 + 0xc);
    pVVar2 = pVVar4 + uVar20 + 1;
    fVar5 = (pVVar2->field_0).m128[0];
    fVar6 = (pVVar2->field_0).m128[1];
    fVar7 = (pVVar2->field_0).m128[2];
    fVar8 = (pVVar2->field_0).m128[3];
    pVVar2 = pVVar4 + uVar20 + 2;
    fVar9 = (pVVar2->field_0).m128[0];
    fVar10 = (pVVar2->field_0).m128[1];
    fVar11 = (pVVar2->field_0).m128[2];
    fVar12 = (pVVar2->field_0).m128[3];
    pVVar2 = pVVar4 + uVar20 + 3;
    uVar13 = *(uint *)&pVVar2->field_0;
    uVar14 = *(uint *)((long)&pVVar2->field_0 + 4);
    uVar15 = *(uint *)((long)&pVVar2->field_0 + 8);
    uVar16 = *(uint *)((long)&pVVar2->field_0 + 0xc);
    uVar25 = -(uint)((*(uint *)&pVVar1->field_0 & 0x7fffffff) < 0x7f800001);
    uVar26 = -(uint)((uVar17 & 0x7fffffff) < 0x7f800001);
    uVar27 = -(uint)((uVar18 & 0x7fffffff) < 0x7f800001);
    uVar28 = -(uint)((uVar19 & 0x7fffffff) < 0x7f800001);
    uVar21 = -(uint)((uVar13 & 0x7fffffff) < 0x7f800001);
    uVar22 = -(uint)((uVar14 & 0x7fffffff) < 0x7f800001);
    uVar23 = -(uint)((uVar15 & 0x7fffffff) < 0x7f800001);
    uVar24 = -(uint)((uVar16 & 0x7fffffff) < 0x7f800001);
    pVVar4 = pVVar4 + uVar20;
    (pVVar4->field_0).m128[0] =
         (float)(~uVar25 & (uint)((fVar5 + fVar5) - fVar9) | *(uint *)&pVVar1->field_0 & uVar25);
    (pVVar4->field_0).m128[1] =
         (float)(~uVar26 & (uint)((fVar6 + fVar6) - fVar10) | uVar17 & uVar26);
    (pVVar4->field_0).m128[2] =
         (float)(~uVar27 & (uint)((fVar7 + fVar7) - fVar11) | uVar18 & uVar27);
    (pVVar4->field_0).m128[3] =
         (float)(~uVar28 & (uint)((fVar8 + fVar8) - fVar12) | uVar19 & uVar28);
    pVVar1 = positions->items + uVar20 + 3;
    (pVVar1->field_0).m128[0] = (float)(~uVar21 & (uint)((fVar9 + fVar9) - fVar5) | uVar13 & uVar21)
    ;
    (pVVar1->field_0).m128[1] =
         (float)(~uVar22 & (uint)((fVar10 + fVar10) - fVar6) | uVar14 & uVar22);
    (pVVar1->field_0).m128[2] =
         (float)(~uVar23 & (uint)((fVar11 + fVar11) - fVar7) | uVar15 & uVar23);
    (pVVar1->field_0).m128[3] =
         (float)(~uVar24 & (uint)((fVar12 + fVar12) - fVar8) | uVar16 & uVar24);
  }
  return;
}

Assistant:

void fix_bspline_end_points(const std::vector<unsigned>& indices, avector<Vec3ff>& positions)
  {
    for (size_t i=0; i<indices.size(); i++) 
    {
      const size_t idx = indices[i];
      vfloat4 v0 = vfloat4::loadu(&positions[idx+0]);  
      vfloat4 v1 = vfloat4::loadu(&positions[idx+1]);
      vfloat4 v2 = vfloat4::loadu(&positions[idx+2]);
      vfloat4 v3 = vfloat4::loadu(&positions[idx+3]);
      v0 = select(isnan(v0),2.0f*v1-v2,v0); // nan triggers edge rule
      v3 = select(isnan(v3),2.0f*v2-v1,v3); // nan triggers edge rule
      vfloat4::storeu(&positions[idx+0],v0);
      vfloat4::storeu(&positions[idx+3],v3);
    }
  }